

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

int png_write_image_8bit(png_voidp argument)

{
  ushort uVar1;
  int iVar2;
  undefined8 *puVar3;
  png_structrp png_ptr_00;
  png_const_bytep ppVar4;
  png_bytep ppVar5;
  png_byte pVar6;
  int iVar7;
  uint uVar8;
  png_const_bytep ppStack_88;
  png_uint_32 component;
  png_bytep out_ptr_1;
  png_const_uint_16p in_ptr_1;
  png_bytep row_end_1;
  png_uint_32 local_68;
  int c;
  png_uint_32 reciprocal;
  png_byte alphabyte;
  png_uint_16 alpha;
  png_bytep out_ptr;
  png_const_uint_16p in_ptr;
  int aindex;
  png_bytep row_end;
  uint channels;
  png_uint_32 y;
  png_bytep output_row;
  png_const_uint_16p input_row;
  png_structrp png_ptr;
  png_imagep image;
  png_image_write_control *display;
  png_voidp argument_local;
  
  puVar3 = *argument;
  png_ptr_00 = *(png_structrp *)*puVar3;
  output_row = *(png_bytep *)((long)argument + 0x28);
  _channels = *(png_const_bytep *)((long)argument + 0x38);
  row_end._4_4_ = *(int *)(puVar3 + 2);
  iVar7 = 1;
  if ((*(uint *)((long)puVar3 + 0x14) & 2) != 0) {
    iVar7 = 3;
  }
  if ((*(uint *)((long)puVar3 + 0x14) & 1) == 0) {
    iVar2 = *(int *)((long)puVar3 + 0xc);
    for (; row_end._4_4_ != 0; row_end._4_4_ = row_end._4_4_ + -1) {
      out_ptr_1 = output_row;
      ppStack_88 = _channels;
      while (ppStack_88 < _channels + (uint)(iVar2 * iVar7)) {
        uVar8 = (uint)*(ushort *)out_ptr_1 * 0xff;
        *ppStack_88 = (png_byte)
                      ((uint)png_sRGB_base[uVar8 >> 0xf] +
                       ((uVar8 & 0x7fff) * (uint)png_sRGB_delta[uVar8 >> 0xf] >> 0xc) >> 8);
        ppStack_88 = ppStack_88 + 1;
        out_ptr_1 = out_ptr_1 + 2;
      }
      png_write_row(png_ptr_00,_channels);
      output_row = output_row + (*(ulong *)((long)argument + 0x30) & 0xfffe);
    }
  }
  else {
    in_ptr._4_4_ = iVar7;
    if ((*(uint *)((long)puVar3 + 0x14) & 0x20) != 0) {
      in_ptr._4_4_ = -1;
      output_row = output_row + 2;
      _channels = _channels + 1;
    }
    iVar2 = *(int *)((long)puVar3 + 0xc);
    for (; row_end._4_4_ != 0; row_end._4_4_ = row_end._4_4_ + -1) {
      out_ptr = output_row;
      for (_reciprocal = _channels; _reciprocal < _channels + (uint)(iVar2 * (iVar7 + 1));
          _reciprocal = _reciprocal + 2) {
        uVar1 = *(ushort *)(out_ptr + (long)in_ptr._4_4_ * 2);
        pVar6 = (png_byte)((uint)uVar1 * 0xff + 0x807f >> 0x10);
        local_68 = 0;
        _reciprocal[in_ptr._4_4_] = pVar6;
        row_end_1._4_4_ = iVar7;
        ppVar4 = _reciprocal;
        ppVar5 = out_ptr;
        if ((pVar6 != '\0') && (pVar6 != 0xff)) {
          local_68 = (((int)(uint)uVar1 >> 1) + 0x7f7f8080) / (int)(uint)uVar1;
        }
        do {
          out_ptr = ppVar5;
          _reciprocal = ppVar4;
          pVar6 = png_unpremultiply((uint)*(ushort *)out_ptr,(uint)uVar1,local_68);
          *_reciprocal = pVar6;
          row_end_1._4_4_ = row_end_1._4_4_ + -1;
          ppVar4 = _reciprocal + 1;
          ppVar5 = out_ptr + 2;
        } while (0 < row_end_1._4_4_);
        out_ptr = out_ptr + 4;
      }
      png_write_row(png_ptr_00,*(png_const_bytep *)((long)argument + 0x38));
      output_row = output_row + (*(ulong *)((long)argument + 0x30) & 0xfffe);
    }
  }
  return 1;
}

Assistant:

static int
png_write_image_8bit(png_voidp argument)
{
   png_image_write_control *display = png_voidcast(png_image_write_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;

   png_const_uint_16p input_row = png_voidcast(png_const_uint_16p,
       display->first_row);
   png_bytep output_row = png_voidcast(png_bytep, display->local_row);
   png_uint_32 y = image->height;
   unsigned int channels = (image->format & PNG_FORMAT_FLAG_COLOR) != 0 ?
       3 : 1;

   if ((image->format & PNG_FORMAT_FLAG_ALPHA) != 0)
   {
      png_bytep row_end;
      int aindex;

#   ifdef PNG_SIMPLIFIED_WRITE_AFIRST_SUPPORTED
      if ((image->format & PNG_FORMAT_FLAG_AFIRST) != 0)
      {
         aindex = -1;
         ++input_row; /* To point to the first component */
         ++output_row;
      }

      else
#   endif
      aindex = (int)channels;

      /* Use row_end in place of a loop counter: */
      row_end = output_row + image->width * (channels+1);

      for (; y > 0; --y)
      {
         png_const_uint_16p in_ptr = input_row;
         png_bytep out_ptr = output_row;

         while (out_ptr < row_end)
         {
            png_uint_16 alpha = in_ptr[aindex];
            png_byte alphabyte = (png_byte)PNG_DIV257(alpha);
            png_uint_32 reciprocal = 0;
            int c;

            /* Scale and write the alpha channel. */
            out_ptr[aindex] = alphabyte;

            if (alphabyte > 0 && alphabyte < 255)
               reciprocal = UNP_RECIPROCAL(alpha);

            c = (int)channels;
            do /* always at least one channel */
               *out_ptr++ = png_unpremultiply(*in_ptr++, alpha, reciprocal);
            while (--c > 0);

            /* Skip to next component (skip the intervening alpha channel) */
            ++in_ptr;
            ++out_ptr;
         } /* while out_ptr < row_end */

         png_write_row(png_ptr, png_voidcast(png_const_bytep,
             display->local_row));
         input_row += (png_uint_16)display->row_bytes/(sizeof (png_uint_16));
      } /* while y */
   }

   else
   {
      /* No alpha channel, so the row_end really is the end of the row and it
       * is sufficient to loop over the components one by one.
       */
      png_bytep row_end = output_row + image->width * channels;

      for (; y > 0; --y)
      {
         png_const_uint_16p in_ptr = input_row;
         png_bytep out_ptr = output_row;

         while (out_ptr < row_end)
         {
            png_uint_32 component = *in_ptr++;

            component *= 255;
            *out_ptr++ = (png_byte)PNG_sRGB_FROM_LINEAR(component);
         }

         png_write_row(png_ptr, output_row);
         input_row += (png_uint_16)display->row_bytes/(sizeof (png_uint_16));
      }
   }

   return 1;
}